

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TennisTest.cpp
# Opt level: O2

void __thiscall
TennisTest_ScoresAreZeroAtStart_Test::TestBody(TennisTest_ScoresAreZeroAtStart_Test *this)

{
  char *message;
  undefined1 local_58 [8];
  string score;
  AssertionResult gtest_ar;
  AssertHelper local_20;
  Tennis local_11 [8];
  Tennis t1;
  
  Tennis::score_abi_cxx11_((string *)local_58,local_11);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[30]>
            ((internal *)(score.field_2._M_local_buf + 8),"score",
             "\"Player 1: love Player 2: love\"",(string *)local_58,
             (char (*) [30])"Player 1: love Player 2: love");
  if (score.field_2._M_local_buf[8] == '\0') {
    testing::Message::Message((Message *)&gtest_ar.message_);
    if (gtest_ar._0_8_ == 0) {
      message = "";
    }
    else {
      message = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jmossberg[P]tenniskatacpp/test/TennisTest.cpp"
               ,0xe,message);
    testing::internal::AssertHelper::operator=(&local_20,(Message *)&gtest_ar.message_);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar.message_);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&gtest_ar);
  std::__cxx11::string::~string((string *)local_58);
  return;
}

Assistant:

TEST(TennisTest, ScoresAreZeroAtStart)
{
    //Setup
    Tennis t1;

    //Execute
    std::string score = t1.score();

    //Verify
    //Zero points are called "love" in a Tennis game
    ASSERT_EQ(score, "Player 1: love Player 2: love");
}